

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avrogencpp.cc
# Opt level: O1

void __thiscall
PendingSetterGetter::PendingSetterGetter
          (PendingSetterGetter *this,string *sn,string *t,string *n,size_t i)

{
  pointer pcVar1;
  
  (this->structName)._M_dataplus._M_p = (pointer)&(this->structName).field_2;
  pcVar1 = (sn->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + sn->_M_string_length);
  (this->type)._M_dataplus._M_p = (pointer)&(this->type).field_2;
  pcVar1 = (t->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->type,pcVar1,pcVar1 + t->_M_string_length);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (n->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + n->_M_string_length);
  this->idx = i;
  return;
}

Assistant:

PendingSetterGetter(const string& sn, const string& t,
        const string& n, size_t i) :
        structName(sn), type(t), name(n), idx(i) { }